

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O3

Type * __thiscall Expr::DataType(Expr *this,Env *env)

{
  CaseExprList *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ExternType *pEVar5;
  ExternType *type2;
  undefined4 extraout_var;
  Type *pTVar6;
  Type *type2_00;
  undefined4 extraout_var_00;
  Exception *pEVar7;
  pointer ppCVar8;
  ExternType *pEVar9;
  ExternType *pEVar10;
  ExternType *type1;
  undefined8 local_b0 [4];
  undefined8 local_90 [4];
  string local_70;
  string local_50;
  
  for (; this->expr_type_ - EXPR_PAREN < 2; this = this->operand_[0]) {
  }
  switch(this->expr_type_) {
  case EXPR_ID:
    pTVar6 = Env::GetDataType(env,this->id_);
    return pTVar6;
  case EXPR_NUM:
  case EXPR_SIZEOF:
  case EXPR_OFFSETOF:
  case EXPR_NEG:
  case EXPR_PLUS:
  case EXPR_MINUS:
  case EXPR_TIMES:
  case EXPR_DIV:
  case EXPR_MOD:
  case EXPR_BITNOT:
  case EXPR_BITAND:
  case EXPR_BITOR:
  case EXPR_BITXOR:
  case EXPR_LSHIFT:
  case EXPR_RSHIFT:
  case EXPR_EQUAL:
  case EXPR_GE:
  case EXPR_LE:
  case EXPR_GT:
  case EXPR_LT:
  case EXPR_NOT:
  case EXPR_AND:
  case EXPR_OR:
    return &extern_type_int->super_Type;
  case EXPR_SUBSCRIPT:
    pTVar6 = DataType(this->operand_[0],env);
    iVar3 = (*(pTVar6->super_DataDepElement)._vptr_DataDepElement[0xe])(pTVar6);
    return (Type *)CONCAT44(extraout_var,iVar3);
  case EXPR_MEMBER:
    pTVar6 = DataType(this->operand_[0],env);
    if (pTVar6 != (Type *)0x0) {
      iVar3 = (*(pTVar6->super_DataDepElement)._vptr_DataDepElement[0xd])
                        (pTVar6,this->operand_[1]->id_);
      return (Type *)CONCAT44(extraout_var_00,iVar3);
    }
    break;
  case EXPR_COND:
    pTVar6 = DataType(this->operand_[1],env);
    type2_00 = DataType(this->operand_[2],env);
    bVar2 = Type::CompatibleTypes(pTVar6,type2_00);
    if (bVar2) {
      return pTVar6;
    }
    pEVar7 = (Exception *)__cxa_allocate_exception(0x20);
    (*(pTVar6->super_DataDepElement)._vptr_DataDepElement[0xb])(local_b0,pTVar6);
    (*(type2_00->super_DataDepElement)._vptr_DataDepElement[0xb])(local_90,type2_00);
    strfmt_abi_cxx11_(&local_50,"type mismatch: %s vs %s",local_b0[0],local_90[0]);
    Exception::Exception(pEVar7,&this->super_Object,&local_50);
    __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
  case EXPR_CASE:
    pCVar1 = this->cases_;
    if ((pCVar1 != (CaseExprList *)0x0) &&
       (ppCVar8 = (pCVar1->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
                  super__Vector_impl_data._M_start,
       ppCVar8 !=
       (pCVar1->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
       super__Vector_impl_data._M_finish)) {
      pEVar5 = (ExternType *)DataType((*ppCVar8)->value_,env);
      pCVar1 = this->cases_;
      if ((pCVar1 == (CaseExprList *)0x0) ||
         (ppCVar8 = (pCVar1->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
                    super__Vector_impl_data._M_start,
         ppCVar8 ==
         (pCVar1->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
         super__Vector_impl_data._M_finish)) {
        pEVar10 = (ExternType *)0x0;
      }
      else {
        pEVar9 = (ExternType *)0x0;
        type1 = pEVar5;
        do {
          type2 = (ExternType *)DataType((*ppCVar8)->value_,env);
          bVar2 = Type::CompatibleTypes(&type1->super_Type,(Type *)type2);
          if (!bVar2) {
            pEVar7 = (Exception *)__cxa_allocate_exception(0x20);
            (*(type1->super_Type).super_DataDepElement._vptr_DataDepElement[0xb])(local_b0,type1);
            (*(type2->super_Type).super_DataDepElement._vptr_DataDepElement[0xb])(local_90,type2);
            strfmt_abi_cxx11_(&local_70,"type mismatch: %s vs %s",local_b0[0],local_90[0]);
            Exception::Exception(pEVar7,&this->super_Object,&local_70);
            __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
          }
          pEVar5 = type2;
          if (type1 != extern_type_nullptr) {
            pEVar5 = type1;
          }
          pEVar10 = pEVar9;
          if (((type2 != (ExternType *)0x0) &&
              (iVar3 = (*(type2->super_Type).super_DataDepElement._vptr_DataDepElement[0x11])(type2)
              , (char)iVar3 != '\0')) && (pEVar10 = type2, pEVar9 != (ExternType *)0x0)) {
            iVar3 = 4;
            if ((pEVar9->super_Type).tot_ != EXTERN) {
              iVar3 = (*(pEVar9->super_Type).super_DataDepElement._vptr_DataDepElement[0x13])
                                (pEVar9,env);
            }
            iVar4 = 4;
            if ((type2->super_Type).tot_ != EXTERN) {
              iVar4 = (*(type2->super_Type).super_DataDepElement._vptr_DataDepElement[0x13])
                                (type2,env);
            }
            if (iVar4 <= iVar3) {
              pEVar10 = pEVar9;
            }
          }
          ppCVar8 = ppCVar8 + 1;
          pEVar9 = pEVar10;
          type1 = pEVar5;
        } while (ppCVar8 !=
                 (this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish);
      }
      if (pEVar10 == (ExternType *)0x0) {
        return &pEVar5->super_Type;
      }
      return &pEVar10->super_Type;
    }
  }
  return (Type *)0x0;
}

Assistant:

Type* Expr::DataType(Env* env) const
	{
	Type* data_type;

	switch ( expr_type_ )
		{
		case EXPR_ID:
			data_type = env->GetDataType(id_);
			break;

		case EXPR_MEMBER:
			{
			// Get type of the parent
			Type* parent_type = operand_[0]->DataType(env);
			if ( ! parent_type )
				return nullptr;
			data_type = parent_type->MemberDataType(operand_[1]->id());
			}
			break;

		case EXPR_SUBSCRIPT:
			{
			// Get type of the parent
			Type* parent_type = operand_[0]->DataType(env);
			data_type = parent_type->ElementDataType();
			}
			break;

		case EXPR_PAREN:
			data_type = operand_[0]->DataType(env);
			break;

		case EXPR_COND:
			{
			Type* type1 = operand_[1]->DataType(env);
			Type* type2 = operand_[2]->DataType(env);
			if ( ! Type::CompatibleTypes(type1, type2) )
				{
				throw Exception(this,
				                strfmt("type mismatch: %s vs %s", type1->DataTypeStr().c_str(),
				                       type2->DataTypeStr().c_str()));
				}
			data_type = type1;
			}
			break;

		case EXPR_CALL:
			data_type = operand_[0]->DataType(env);
			break;

		case EXPR_CASE:
			{
			if ( cases_ && ! cases_->empty() )
				{
				Type* type1 = cases_->front()->value()->DataType(env);
				Type* numeric_with_largest_width = nullptr;

				foreach (i, CaseExprList, cases_)
					{
					Type* type2 = (*i)->value()->DataType(env);
					if ( ! Type::CompatibleTypes(type1, type2) )
						{
						throw Exception(this, strfmt("type mismatch: %s vs %s",
						                             type1->DataTypeStr().c_str(),
						                             type2->DataTypeStr().c_str()));
						}
					if ( type1 == extern_type_nullptr )
						type1 = type2;

					if ( type2 && type2->IsNumericType() )
						{
						if ( numeric_with_largest_width )
							{
							int largest;
							int contender;

							// External C++ types like "int", "bool", "enum" use "int"
							// storage internally.
							if ( numeric_with_largest_width->tot() == Type::EXTERN )
								largest = sizeof(int);
							else
								largest = numeric_with_largest_width->StaticSize(env);

							if ( type2->tot() == Type::EXTERN )
								contender = sizeof(int);
							else
								contender = type2->StaticSize(env);

							if ( contender > largest )
								numeric_with_largest_width = type2;
							}
						else
							numeric_with_largest_width = type2;
						}
					}
				data_type = numeric_with_largest_width ? numeric_with_largest_width : type1;
				}
			else
				data_type = nullptr;
			}
			break;

		case EXPR_NUM:
		case EXPR_SIZEOF:
		case EXPR_OFFSETOF:
		case EXPR_NEG:
		case EXPR_PLUS:
		case EXPR_MINUS:
		case EXPR_TIMES:
		case EXPR_DIV:
		case EXPR_MOD:
		case EXPR_BITNOT:
		case EXPR_BITAND:
		case EXPR_BITOR:
		case EXPR_BITXOR:
		case EXPR_LSHIFT:
		case EXPR_RSHIFT:
		case EXPR_EQUAL:
		case EXPR_GE:
		case EXPR_LE:
		case EXPR_GT:
		case EXPR_LT:
		case EXPR_NOT:
		case EXPR_AND:
		case EXPR_OR:
			data_type = extern_type_int;
			break;

		default:
			data_type = nullptr;
			break;
		}

	return data_type;
	}